

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O3

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramFunctor,unsigned_short>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  long lVar4;
  data_ptr_t pdVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar6;
  element_type *peVar7;
  element_type *peVar8;
  bool bVar9;
  idx_t index;
  LogicalType *type;
  Vector *this_00;
  Vector *pVVar10;
  ulong uVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  _Head_base<0UL,_unsigned_long_*,_false> _Var13;
  long *plVar14;
  idx_t iVar15;
  idx_t iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long *plVar21;
  UnifiedVectorFormat sdata;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  element_type *local_78;
  element_type *peStack_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(state_vector,count,&local_c0);
  FlatVector::VerifyFlatVector(result);
  index = ListVector::GetListSize(result);
  type = MapType::KeyType(&result->type);
  bVar9 = SupportsOtherBucket(type);
  if (count == 0) {
    lVar19 = 0;
  }
  else {
    lVar19 = 0;
    iVar15 = 0;
    do {
      iVar16 = iVar15;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(local_c0.sel)->sel_vector[iVar15];
      }
      plVar21 = (long *)**(long **)(local_c0.data + iVar16 * 8);
      if (plVar21 != (long *)0x0) {
        lVar19 = (ulong)(*(long *)(*(long *)((*(long **)(local_c0.data + iVar16 * 8))[1] + 8) + -8)
                         != 0 && bVar9) + (plVar21[1] - *plVar21 >> 1) + lVar19;
      }
      iVar15 = iVar15 + 1;
    } while (count != iVar15);
  }
  ListVector::Reserve(result,lVar19 + index);
  this_00 = MapVector::GetKeys(result);
  pVVar10 = MapVector::GetValues(result);
  if (count != 0) {
    pdVar2 = result->data;
    pdVar3 = pVVar10->data;
    uVar18 = 0;
    do {
      uVar11 = uVar18;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)(local_c0.sel)->sel_vector[uVar18];
      }
      uVar1 = offset + uVar18;
      plVar21 = *(long **)(local_c0.data + uVar11 * 8);
      plVar14 = (long *)*plVar21;
      if (plVar14 == (long *)0x0) {
        _Var13._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var13._M_head_impl == (unsigned_long *)0x0) {
          local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_c8);
          peVar8 = peStack_70;
          peVar7 = local_78;
          local_78 = (element_type *)0x0;
          peStack_70 = (element_type *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar7;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             peStack_70 != (element_type *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_70);
          }
          pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var13._M_head_impl =
               (pTVar12->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var13._M_head_impl;
        }
        bVar6 = (byte)uVar1 & 0x3f;
        _Var13._M_head_impl[uVar1 >> 6] =
             _Var13._M_head_impl[uVar1 >> 6] & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      }
      else {
        *(idx_t *)(pdVar2 + uVar1 * 0x10) = index;
        lVar19 = *plVar14;
        lVar17 = plVar14[1] - lVar19;
        if (lVar17 == 0) {
          plVar14 = (long *)plVar21[1];
        }
        else {
          lVar17 = lVar17 >> 1;
          plVar14 = (long *)plVar21[1];
          lVar4 = *plVar14;
          pdVar5 = this_00->data;
          lVar20 = 0;
          do {
            *(undefined2 *)(pdVar5 + lVar20 * 2 + index * 2) = *(undefined2 *)(lVar19 + lVar20 * 2);
            *(undefined8 *)(pdVar3 + lVar20 * 8 + index * 8) = *(undefined8 *)(lVar4 + lVar20 * 8);
            lVar20 = lVar20 + 1;
          } while (lVar17 + (ulong)(lVar17 == 0) != lVar20);
          index = index + lVar20;
        }
        if (bVar9 && *(long *)(plVar14[1] + -8) != 0) {
          OtherBucketValue((Value *)&local_78,&this_00->type);
          Vector::SetValue(this_00,index,(Value *)&local_78);
          Value::~Value((Value *)&local_78);
          *(undefined8 *)(pdVar3 + index * 8) = *(undefined8 *)(*(long *)(plVar21[1] + 8) + -8);
          index = index + 1;
        }
        plVar21 = (long *)(pdVar2 + uVar1 * 0x10);
        plVar21[1] = index - *plVar21;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != count);
  }
  ListVector::SetListSize(result,index);
  Vector::Verify(result,count);
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}